

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *
BoxNesting::Parser::getBoxes
          (vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *__return_storage_ptr__,
          istream *inputStream)

{
  uint uVar1;
  ostream *poVar2;
  ParserError *this;
  ulong __n;
  bool bVar3;
  string local_1f0;
  string inputLine;
  stringstream ss;
  ostream local_1a0 [376];
  
  inputLine._M_dataplus._M_p = (pointer)&inputLine.field_2;
  inputLine._M_string_length = 0;
  inputLine.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>(inputStream,(string *)&inputLine);
  uVar1 = std::__cxx11::stoi(&inputLine,(size_t *)0x0,10);
  if (0xffffec77 < uVar1 - 0x1389) {
    __n = (ulong)uVar1;
    (__return_storage_ptr__->super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>::reserve
              (__return_storage_ptr__,__n);
    while (bVar3 = __n != 0, __n = __n - 1, bVar3) {
      parseBoxSpecification((Box *)&ss,inputStream);
      std::vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>::emplace_back<BoxNesting::Box>
                (__return_storage_ptr__,(Box *)&ss);
    }
    std::__cxx11::string::~string((string *)&inputLine);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_1a0,"Amount of boxes is smaller then 1 or too large, max allowed: "
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,5000);
  poVar2 = std::operator<<(poVar2,". Got: \"");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  std::operator<<(poVar2,"\"");
  this = (ParserError *)__cxa_allocate_exception(0x18);
  std::__cxx11::stringbuf::str();
  ParserError::ParserError(this,&local_1f0);
  __cxa_throw(this,&ParserError::typeinfo,ParserError::~ParserError);
}

Assistant:

std::vector<Box> Parser::getBoxes(std::istream& inputStream)
{
	std::string inputLine;
	std::getline(inputStream, inputLine);

	int16_t boxCount = 0;
	static const auto max = 5000;
	try {
		auto tmp = std::stoi(inputLine);
		if (tmp <= 0 || tmp > max) {
			std::stringstream ss;
			ss << "Amount of boxes is smaller then 1 or too large, max allowed: " << max << ". Got: \"" << tmp << "\"";
			throw ParserError(ss.str());
		}
		boxCount = static_cast<int16_t>(tmp);
	} catch (const std::invalid_argument& e) {
		std::stringstream ss;
		ss << "Expected number to indicate amount of boxes to take from input. Got: \"" << inputLine << "\"";
		throw ParserError(ss.str(), e);
	} catch (const std::out_of_range& e) {
		std::stringstream ss;
		ss << "Number of boxes is too large to handle for this program, max allowed: " << max;
		throw ParserError(ss.str(), e);
	}

	std::vector<Box> boxes;
	boxes.reserve(boxCount);
	for (std::size_t i = 0; i < boxCount; ++i) {
		boxes.emplace_back(parseBoxSpecification(inputStream));
	}

	return boxes;
}